

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O2

Lazy<bool> __thiscall
cinatra::coro_http_connection::reply(coro_http_connection *this,bool need_to_bufffer)

{
  implementation_type *piVar1;
  element_type *peVar2;
  undefined1 in_DL;
  undefined7 in_register_00000031;
  
  peVar2 = (element_type *)operator_new(0x80,(nothrow_t *)&std::nothrow);
  if (peVar2 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2> = reply;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar2->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reply;
    (peVar2->head_buf_).field_0x1 = in_DL;
    peVar2->router_ = (coro_http_router *)CONCAT71(in_register_00000031,need_to_bufffer);
    peVar2->executor_ =
         (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *)0x0;
    (peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ =
         (service_type *)0x0;
    piVar1 = (implementation_type *)
             ((long)&(peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.
                     impl_ + 8);
    (piVar1->super_base_implementation_type).socket_ = 0;
    (piVar1->super_base_implementation_type).state_ = '\0';
    *(undefined3 *)&(piVar1->super_base_implementation_type).field_0x5 = 0;
    *(undefined1 *)
     &((protocol_type *)
      ((long)&(peVar2->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_ +
      0x18))->family_ = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (peVar2->head_buf_).super_streambuf = (streambuf)0x0;
  }
  return (LazyBase<bool,_false>)(LazyBase<bool,_false>)this;
}

Assistant:

async_simple::coro::Lazy<bool> reply(bool need_to_bufffer = true) {
    std::error_code ec;
    size_t size;
    if (multi_buf_) {
      if (need_to_bufffer) {
        response_.to_buffers(buffers_, chunk_size_str_);
      }
      std::tie(ec, size) = co_await async_write(buffers_);
    }
    else {
      if (need_to_bufffer) {
        response_.build_resp_str(resp_str_);
      }
      std::tie(ec, size) = co_await async_write(asio::buffer(resp_str_));
    }

    if (ec) {
      CINATRA_LOG_ERROR << "async_write error: " << ec.message();
      close();
      co_return false;
    }

    co_return true;
  }